

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_attribute_decoders_controller.cc
# Opt level: O1

bool __thiscall
draco::SequentialAttributeDecodersController::DecodeAttributesDecoderData
          (SequentialAttributeDecodersController *this,DecoderBuffer *buffer)

{
  long lVar1;
  pointer puVar2;
  __uniq_ptr_impl<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
  _Var3;
  _Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false> _Var4;
  bool bVar5;
  char cVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  pointer *__ptr;
  ulong uVar10;
  uint8_t decoder_type;
  _Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false> local_48;
  ulong local_40;
  vector<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
  *local_38;
  
  bVar5 = AttributesDecoder::DecodeAttributesDecoderData(&this->super_AttributesDecoder,buffer);
  if (bVar5) {
    uVar7 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
              _vptr_AttributesDecoderInterface[6])(this);
    local_38 = &this->sequential_decoders_;
    std::
    vector<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
    ::resize(local_38,(long)(int)uVar7);
    bVar5 = (int)uVar7 < 1;
    if (0 < (int)uVar7) {
      local_40 = (ulong)uVar7;
      uVar10 = 0;
      do {
        lVar1 = buffer->pos_ + 1;
        if (buffer->data_size_ < lVar1) goto LAB_00148856;
        cVar6 = buffer->data_[buffer->pos_];
        buffer->pos_ = lVar1;
        (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
          _vptr_AttributesDecoderInterface[0xc])(&local_48,this,cVar6);
        _Var4._M_head_impl = local_48._M_head_impl;
        puVar2 = (this->sequential_decoders_).
                 super__Vector_base<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_48._M_head_impl = (SequentialAttributeDecoder *)0x0;
        _Var3._M_t.
        super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
        .super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>._M_head_impl =
             puVar2[uVar10]._M_t.
             super___uniq_ptr_impl<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
             ._M_t;
        puVar2[uVar10]._M_t.
        super___uniq_ptr_impl<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
        ._M_t = (tuple<draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
                 )_Var4._M_head_impl;
        if ((_Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
             )_Var3._M_t.
              super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
              .super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>._M_head_impl !=
            (SequentialAttributeDecoder *)0x0) {
          (**(code **)(*(long *)_Var3._M_t.
                                super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
                                .super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>.
                                _M_head_impl + 8))();
        }
        if (local_48._M_head_impl != (SequentialAttributeDecoder *)0x0) {
          (*(local_48._M_head_impl)->_vptr_SequentialAttributeDecoder[1])();
        }
        _Var3._M_t.
        super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
        .super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>._M_head_impl =
             (local_38->
             super__Vector_base<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start[uVar10]._M_t.
             super___uniq_ptr_impl<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
             ._M_t;
        if ((_Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
             )_Var3._M_t.
              super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
              .super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>._M_head_impl ==
            (SequentialAttributeDecoder *)0x0) goto LAB_00148856;
        iVar8 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                  _vptr_AttributesDecoderInterface[7])(this);
        iVar9 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                  _vptr_AttributesDecoderInterface[5])(this,uVar10 & 0xffffffff);
        cVar6 = (**(code **)(*(long *)_Var3._M_t.
                                      super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
                                      .
                                      super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>
                                      ._M_head_impl + 0x10))
                          (_Var3._M_t.
                           super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
                           .super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>.
                           _M_head_impl,iVar8,iVar9);
        if (cVar6 == '\0') goto LAB_00148856;
        uVar10 = uVar10 + 1;
      } while (local_40 != uVar10);
      bVar5 = local_40 <= uVar10;
    }
  }
  else {
LAB_00148856:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool SequentialAttributeDecodersController::DecodeAttributesDecoderData(
    DecoderBuffer *buffer) {
  if (!AttributesDecoder::DecodeAttributesDecoderData(buffer)) {
    return false;
  }
  // Decode unique ids of all sequential encoders and create them.
  const int32_t num_attributes = GetNumAttributes();
  sequential_decoders_.resize(num_attributes);
  for (int i = 0; i < num_attributes; ++i) {
    uint8_t decoder_type;
    if (!buffer->Decode(&decoder_type)) {
      return false;
    }
    // Create the decoder from the id.
    sequential_decoders_[i] = CreateSequentialDecoder(decoder_type);
    if (!sequential_decoders_[i]) {
      return false;
    }
    if (!sequential_decoders_[i]->Init(GetDecoder(), GetAttributeId(i))) {
      return false;
    }
  }
  return true;
}